

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::SplitProgramFromArgs(string *path,string *program,string *args)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  string dir;
  string findProg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  string tryProg;
  string local_50;
  
  bVar1 = FileExists(path);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)program);
    std::__cxx11::string::assign((char *)args);
    return;
  }
  e.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  e.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  e.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindProgram(&findProg,path,&e,false);
  if (findProg._M_string_length == 0) {
    std::__cxx11::string::string((string *)&dir,(string *)path);
    lVar2 = std::__cxx11::string::rfind((char)&dir,0x20);
    do {
      if (lVar2 == -1) {
        std::__cxx11::string::assign((char *)program);
        std::__cxx11::string::assign((char *)args);
        break;
      }
      std::__cxx11::string::substr((ulong)&tryProg,(ulong)&dir);
      bVar1 = FileExists(&tryProg);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)program);
        sVar3 = program->_M_string_length;
        while (sVar3 = sVar3 - 1, (program->_M_dataplus)._M_p[sVar3] == ' ') {
          std::__cxx11::string::erase((ulong)program,sVar3);
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&dir);
LAB_003c4906:
        std::__cxx11::string::operator=((string *)args,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar1 = false;
      }
      else {
        FindProgram(&local_50,&tryProg,&e,false);
        std::__cxx11::string::operator=((string *)&findProg,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (findProg._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)program);
          sVar3 = program->_M_string_length;
          while (sVar3 = sVar3 - 1, (program->_M_dataplus)._M_p[sVar3] == ' ') {
            std::__cxx11::string::erase((ulong)program,sVar3);
          }
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&dir);
          goto LAB_003c4906;
        }
        lVar2 = std::__cxx11::string::rfind((char)&dir,0x20);
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)&tryProg);
    } while (bVar1);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    std::__cxx11::string::_M_assign((string *)program);
    std::__cxx11::string::assign((char *)args);
  }
  std::__cxx11::string::~string((string *)&findProg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&e);
  return;
}

Assistant:

void SystemTools::SplitProgramFromArgs(const kwsys_stl::string& path,
                                       kwsys_stl::string& program, kwsys_stl::string& args)
{
  // see if this is a full path to a program
  // if so then set program to path and args to nothing
  if(SystemTools::FileExists(path))
    {
    program = path;
    args = "";
    return;
    }
  // Try to find the program in the path, note the program
  // may have spaces in its name so we have to look for it
  kwsys_stl::vector<kwsys_stl::string> e;
  kwsys_stl::string findProg = SystemTools::FindProgram(path, e);
  if(!findProg.empty())
    {
    program = findProg;
    args = "";
    return;
    }

  // Now try and peel off space separated chunks from the end of the string
  // so the largest path possible is found allowing for spaces in the path
  kwsys_stl::string dir = path;
  kwsys_stl::string::size_type spacePos = dir.rfind(' ');
  while(spacePos != kwsys_stl::string::npos)
    {
    kwsys_stl::string tryProg = dir.substr(0, spacePos);
    // See if the file exists
    if(SystemTools::FileExists(tryProg))
      {
      program = tryProg;
      // remove trailing spaces from program
      kwsys_stl::string::size_type pos = program.size()-1;
      while(program[pos] == ' ')
        {
        program.erase(pos);
        pos--;
        }
      args = dir.substr(spacePos, dir.size()-spacePos);
      return;
      }
    // Now try and find the program in the path
    findProg = SystemTools::FindProgram(tryProg, e);
    if(!findProg.empty())
      {
      program = findProg;
      // remove trailing spaces from program
      kwsys_stl::string::size_type pos = program.size()-1;
      while(program[pos] == ' ')
        {
        program.erase(pos);
        pos--;
        }
      args = dir.substr(spacePos, dir.size()-spacePos);
      return;
      }
    // move past the space for the next search
    spacePos--;
    spacePos = dir.rfind(' ', spacePos);
    }

  program = "";
  args = "";
}